

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

char tcu::anon_unknown_74::convertSatRte<signed_char>(float f)

{
  char cVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  
  fVar4 = floorf(f);
  fVar4 = f - fVar4;
  lVar2 = (long)(f - fVar4);
  if ((fVar4 != 0.5) || (NAN(fVar4))) {
    if (0.5 < fVar4) {
      lVar2 = lVar2 + 1;
    }
  }
  else {
    lVar2 = lVar2 + (ulong)((uint)lVar2 & 1);
  }
  lVar3 = 0x7f;
  if (lVar2 < 0x7f) {
    lVar3 = lVar2;
  }
  cVar1 = -0x80;
  if (-0x80 < lVar3) {
    cVar1 = (char)lVar3;
  }
  return cVar1;
}

Assistant:

inline T convertSatRte (float f)
{
	// \note Doesn't work for 64-bit types
	DE_STATIC_ASSERT(sizeof(T) < sizeof(deUint64));
	DE_STATIC_ASSERT((-3 % 2 != 0) && (-4 % 2 == 0));

	deInt64	minVal	= std::numeric_limits<T>::min();
	deInt64 maxVal	= std::numeric_limits<T>::max();
	float	q		= deFloatFrac(f);
	deInt64 intVal	= (deInt64)(f-q);

	// Rounding.
	if (q == 0.5f)
	{
		if (intVal % 2 != 0)
			intVal++;
	}
	else if (q > 0.5f)
		intVal++;
	// else Don't add anything

	// Saturate.
	intVal = de::max(minVal, de::min(maxVal, intVal));

	return (T)intVal;
}